

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

size_t argparse::details::
       get_levenshtein_distance<std::basic_string_view<char,std::char_traits<char>>>
                 (basic_string_view<char,_std::char_traits<char>_> *s1,
                 basic_string_view<char,_std::char_traits<char>_> *s2)

{
  char cVar1;
  value_type vVar2;
  initializer_list<unsigned_long> __l;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_type sVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  const_reference pvVar10;
  unsigned_long uVar11;
  value_type local_a0;
  value_type local_98;
  value_type local_90;
  iterator local_88;
  undefined8 local_80;
  ulong local_78;
  size_t j;
  size_t i;
  allocator<unsigned_long> local_51;
  value_type_conflict1 local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  undefined1 local_30 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  dp;
  basic_string_view<char,_std::char_traits<char>_> *s2_local;
  basic_string_view<char,_std::char_traits<char>_> *s1_local;
  
  dp.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)s2;
  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(s1);
  sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     dp.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_50 = 0;
  std::allocator<unsigned_long>::allocator(&local_51);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,sVar7 + 1,&local_50,&local_51);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             ((long)&i + 3));
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)local_30,sVar6 + 1,&local_48,
           (allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)((long)&i + 3))
  ;
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             ((long)&i + 3));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_48);
  std::allocator<unsigned_long>::~allocator(&local_51);
  for (j = 0; sVar5 = j, sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(s1),
      sVar5 <= sVar6; j = j + 1) {
    for (local_78 = 0; uVar3 = local_78,
        sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           dp.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), sVar5 = j,
        uVar4 = local_78, uVar3 <= sVar6; local_78 = local_78 + 1) {
      if (j == 0) {
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)local_30,0);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar8,local_78);
        *pvVar9 = uVar4;
      }
      else if (local_78 == 0) {
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)local_30,j);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar8,local_78);
        *pvVar9 = sVar5;
      }
      else {
        pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](s1,j - 1);
        cVar1 = *pvVar10;
        pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             dp.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,local_78 - 1);
        if (cVar1 == *pvVar10) {
          pvVar8 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)local_30,j - 1);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar8,local_78 - 1);
          vVar2 = *pvVar9;
          pvVar8 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)local_30,j);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar8,local_78);
          *pvVar9 = vVar2;
        }
        else {
          pvVar8 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)local_30,j - 1);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar8,local_78);
          local_a0 = *pvVar9;
          pvVar8 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)local_30,j);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar8,local_78 - 1);
          local_98 = *pvVar9;
          pvVar8 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)local_30,j - 1);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar8,local_78 - 1);
          local_90 = *pvVar9;
          local_88 = &local_a0;
          local_80 = 3;
          __l._M_len = 3;
          __l._M_array = local_88;
          uVar11 = std::min<unsigned_long>(__l);
          pvVar8 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)local_30,j);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar8,local_78);
          *pvVar9 = uVar11 + 1;
        }
      }
    }
  }
  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(s1);
  pvVar8 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         *)local_30,sVar6);
  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     dp.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar8,sVar6);
  vVar2 = *pvVar9;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_30);
  return vVar2;
}

Assistant:

std::size_t get_levenshtein_distance(const StringType &s1,
                                     const StringType &s2) {
  std::vector<std::vector<std::size_t>> dp(
      s1.size() + 1, std::vector<std::size_t>(s2.size() + 1, 0));

  for (std::size_t i = 0; i <= s1.size(); ++i) {
    for (std::size_t j = 0; j <= s2.size(); ++j) {
      if (i == 0) {
        dp[i][j] = j;
      } else if (j == 0) {
        dp[i][j] = i;
      } else if (s1[i - 1] == s2[j - 1]) {
        dp[i][j] = dp[i - 1][j - 1];
      } else {
        dp[i][j] = 1 + std::min({dp[i - 1][j], dp[i][j - 1], dp[i - 1][j - 1]});
      }
    }
  }

  return dp[s1.size()][s2.size()];
}